

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

string * __thiscall
soul::heart::IODeclaration::getTypesDescription_abi_cxx11_
          (string *__return_storage_ptr__,IODeclaration *this)

{
  anon_class_1_0_00000001 *in_R8;
  undefined1 local_4d [21];
  vector<soul::Type,_std::allocator<soul::Type>_> local_38;
  IODeclaration *local_18;
  IODeclaration *this_local;
  
  local_18 = this;
  this_local = (IODeclaration *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,", ",(allocator<char> *)(local_4d + 0x14));
  joinStrings<std::vector<soul::Type,std::allocator<soul::Type>>,soul::heart::IODeclaration::getTypesDescription[abi:cxx11]()const::_lambda(auto:1&)_1_>
            (__return_storage_ptr__,(soul *)&this->dataTypes,&local_38,(string *)local_4d,in_R8);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)(local_4d + 0x14));
  return __return_storage_ptr__;
}

Assistant:

std::string getTypesDescription() const
        {
            return joinStrings (dataTypes, ", ", [] (auto& t) { return t.getDescription(); });
        }